

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bighexdump.cpp
# Opt level: O0

string * dumpraw_abi_cxx11_(string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  char *__s;
  size_t __n;
  bool bVar1;
  size_t *local_48;
  size_t i;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t *local_28;
  size_t *usedlen_local;
  size_t len_local;
  uint8_t *buf_local;
  string *str;
  
  local_29 = 0;
  local_28 = usedlen;
  usedlen_local = (size_t *)len;
  len_local = (size_t)buf;
  buf_local = (uint8_t *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)buf,len,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  (__return_storage_ptr__);
  __n = strlen(__s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,__n);
  local_48 = (size_t *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (__return_storage_ptr__);
  while( true ) {
    bVar1 = false;
    if (local_48 < usedlen_local) {
      bVar1 = *(char *)(len_local + (long)local_48) == '\0';
    }
    if (!bVar1) break;
    local_48 = (size_t *)((long)local_48 + 1);
  }
  *local_28 = (size_t)local_48;
  return __return_storage_ptr__;
}

Assistant:

std::string dumpraw(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string str((const char*)buf, len);
    str.resize(strlen(str.c_str()));
    size_t i= str.size();
    while (i<len && buf[i]==0) i++;

    usedlen= i;

    return str;
}